

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Type * __thiscall soul::heart::Parser::readValueType(Type *__return_storage_ptr__,Parser *this)

{
  char (*args) [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  StructurePtr s;
  CodeLocation errorPos;
  Type t;
  string name;
  undefined1 local_128 [28];
  Primitive local_10c;
  UTF8Reader local_108;
  RefCountedPtr<soul::Structure> local_100;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  RefCountedPtr<soul::Structure> local_c8;
  CompileMessage local_c0;
  CompileMessage local_88;
  CompileMessage local_50;
  
  local_128._8_8_ =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if ((SourceCodeText *)local_128._8_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_128._8_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_128._8_8_)->super_RefCountedObject).refCount + 1;
  }
  local_128._16_8_ =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  readPrimitiveValueType((Type *)(local_128 + 0x18),this);
  if (1 < local_10c - complex32) {
    if (local_10c == fixed) {
      Errors::notYetImplemented<char_const(&)[6]>(&local_88,(Errors *)"fixed",(char (*) [6])args);
      CodeLocation::throwError((CodeLocation *)(local_128 + 8),&local_88);
    }
    if (local_128[0x18] == '\0') {
      readQualifiedGeneralIdentifier_abi_cxx11_(&local_f8,this);
      findStruct((Parser *)local_128,(string *)this);
      if ((Structure *)local_128._0_8_ == (Structure *)0x0) {
        RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_128);
        Errors::unresolvedType<std::__cxx11::string&>(&local_c0,(Errors *)&local_f8,args_00);
        CodeLocation::throwError((CodeLocation *)(local_128 + 8),&local_c0);
      }
      local_c8.object =
           RefCountedPtr<soul::Structure>::operator*((RefCountedPtr<soul::Structure> *)local_128);
      local_d8._M_local_buf[0] = '\x06';
      local_d8._M_allocated_capacity._1_7_ = 0;
      local_d8._M_local_buf[8] = '\0';
      local_d8._9_7_ = 0;
      ((local_c8.object)->super_RefCountedObject).refCount =
           ((local_c8.object)->super_RefCountedObject).refCount + 1;
      parseArrayTypeSuffixes(__return_storage_ptr__,this,(Type *)&local_d8);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_c8);
      RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_128);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    else {
      __return_storage_ptr__->category = local_128[0x18];
      __return_storage_ptr__->arrayElementCategory = local_128[0x19];
      __return_storage_ptr__->isRef = (bool)local_128[0x1a];
      __return_storage_ptr__->isConstant = (bool)local_128[0x1b];
      (__return_storage_ptr__->primitiveType).type = local_10c;
      *(char **)&__return_storage_ptr__->boundingSize = local_108.data;
      (__return_storage_ptr__->structure).object = local_100.object;
      local_100.object = (Structure *)0x0;
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_100);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)(local_128 + 8));
    return __return_storage_ptr__;
  }
  Errors::notYetImplemented<char_const(&)[8]>(&local_50,(Errors *)0x274f5d,args);
  CodeLocation::throwError((CodeLocation *)(local_128 + 8),&local_50);
}

Assistant:

Type readValueType()
    {
        auto errorPos = location;
        auto t = readPrimitiveValueType();

        if (t.isComplex())  errorPos.throwError (Errors::notYetImplemented ("complex"));
        if (t.isFixed())    errorPos.throwError (Errors::notYetImplemented ("fixed"));

        if (t.isValid())
            return t;

        auto name = readQualifiedGeneralIdentifier();

        if (auto s = findStruct (name))
            return parseArrayTypeSuffixes (Type::createStruct (*s));

        errorPos.throwError (Errors::unresolvedType (name));
    }